

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ModbusAnalyzer.cpp
# Opt level: O3

void __thiscall ModbusAnalyzer::~ModbusAnalyzer(ModbusAnalyzer *this)

{
  pointer puVar1;
  ModbusAnalyzerResults *pMVar2;
  ModbusAnalyzerSettings *pMVar3;
  
  *(undefined ***)this = &PTR__ModbusAnalyzer_00121ca0;
  Analyzer::KillThread();
  puVar1 = (this->mSampleOffsets).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
           _M_impl.super__Vector_impl_data._M_start;
  if (puVar1 != (pointer)0x0) {
    operator_delete(puVar1);
  }
  ModbusSimulationDataGenerator::~ModbusSimulationDataGenerator(&this->mSimulationDataGenerator);
  pMVar2 = (this->mResults)._M_ptr;
  if (pMVar2 != (ModbusAnalyzerResults *)0x0) {
    (**(code **)(*(long *)pMVar2 + 8))();
  }
  pMVar3 = (this->mSettings)._M_ptr;
  if (pMVar3 != (ModbusAnalyzerSettings *)0x0) {
    (**(code **)(*(long *)pMVar3 + 8))();
  }
  Analyzer::~Analyzer((Analyzer *)this);
  return;
}

Assistant:

ModbusAnalyzer::~ModbusAnalyzer()
{
    KillThread();
}